

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O1

void indent(buffer *b,size_t amount)

{
  long lVar1;
  size_t __n;
  undefined1 *__s;
  undefined8 uStack_30;
  undefined1 auStack_28 [8];
  
  __n = amount * 4;
  lVar1 = -(amount * 4 + 0x10 & 0xfffffffffffffff0);
  __s = auStack_28 + lVar1;
  if (__n != 0) {
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x103e93;
    memset(__s,0x20,__n);
  }
  __s[__n] = 0;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x103eac;
  bprintf(b,"%s",__s);
  return;
}

Assistant:

static void indent(struct buffer* b, size_t amount)
{
    size_t spaces = amount * 4; /* 4 spaces per indent */

    char temp[spaces + 1];

    for(size_t i = 0; i < spaces; ++i)
        temp[i] = ' ';
    temp[spaces] = '\0';

    bprintf(b, "%s", temp);
}